

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task32.cpp
# Opt level: O1

double result(string *str)

{
  char *pcVar1;
  int iVar2;
  long *__nptr;
  long lVar3;
  int *piVar4;
  _Elt_pointer pdVar5;
  undefined8 uVar6;
  bool bVar7;
  string tok;
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  long *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  _Deque_base<double,_std::allocator<double>_> local_98;
  double local_40;
  double local_38;
  
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (double *)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (double *)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map(&local_98,0);
  lVar3 = std::__cxx11::string::find((char)str,0x20);
  if (lVar3 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_b8,(ulong)str);
      __nptr = local_b8;
      bVar7 = local_b0 == 0;
      if ((!bVar7) && ((int)(char)*local_b8 - 0x30U < 10)) {
        lVar3 = 1;
        do {
          bVar7 = local_b0 == lVar3;
          if (bVar7) break;
          pcVar1 = (char *)((long)local_b8 + lVar3);
          lVar3 = lVar3 + 1;
        } while ((int)*pcVar1 - 0x30U < 10);
      }
      if (bVar7) {
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        *piVar4 = 0;
        lVar3 = strtol((char *)__nptr,(char **)&local_c0,10);
        if (local_c0 == __nptr) {
          std::__throw_invalid_argument("stoi");
LAB_00102dc7:
          uVar6 = std::__throw_out_of_range("stoi");
          std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_98);
          _Unwind_Resume(uVar6);
        }
        if (((int)lVar3 != lVar3) || (*piVar4 == 0x22)) goto LAB_00102dc7;
        if (*piVar4 == 0) {
          *piVar4 = iVar2;
        }
        local_38 = (double)(int)lVar3;
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<double,_std::allocator<double>_>::_M_push_back_aux<double>
                    ((deque<double,_std::allocator<double>_> *)&local_98,&local_38);
        }
        else {
          *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = local_38;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      else {
        local_c0 = (long *)do_oper((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                                   &local_98,(char)*local_b8);
        if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<double,_std::allocator<double>_>::_M_push_back_aux<double>
                    ((deque<double,_std::allocator<double>_> *)&local_98,(double *)&local_c0);
        }
        else {
          *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (double)local_c0;
          local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
      }
      std::__cxx11::string::erase((ulong)str,0);
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      lVar3 = std::__cxx11::string::find((char)str,0x20);
    } while (lVar3 != -1);
  }
  local_b8 = (long *)do_oper((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                             &local_98,*(str->_M_dataplus)._M_p);
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<double,_std::allocator<double>_>::_M_push_back_aux<double>
              ((deque<double,_std::allocator<double>_> *)&local_98,(double *)&local_b8);
  }
  else {
    *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (double)local_b8;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  pdVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pdVar5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  local_40 = pdVar5[-1];
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_98);
  return local_40;
}

Assistant:

double result (string str) {
    stack<double> temp;
    size_t pos = 0;
    while ((pos = str.find(' ')) != string::npos){
        string tok = str.substr(0, pos);
        if (is_num(tok)) temp.push(stoi(tok));
        else temp.push(do_oper(temp, tok[0]));
        str.erase(0, pos + 1);
    }
    temp.push(do_oper(temp, str[0]));
    return temp.top();
}